

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

int Aig_ManChoiceLevel(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int LevelMax;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      Aig_ObjSetLevel(pAVar2,0);
    }
  }
  Aig_ManSetCioIds(p);
  Aig_ManIncrementTravId(p);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCos), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    Aig_ManChoiceLevel_rec(p,pAVar2);
    iVar1 = Aig_ObjLevel(pAVar2);
    if (local_20 < iVar1) {
      local_20 = Aig_ObjLevel(pAVar2);
    }
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vCis), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_1c);
    Aig_ManChoiceLevel_rec(p,pAVar2);
    iVar1 = Aig_ObjLevel(pAVar2);
    if (local_20 < iVar1) {
      local_20 = Aig_ObjLevel(pAVar2);
    }
  }
  Aig_ManCleanCioIds(p);
  return local_20;
}

Assistant:

int Aig_ManChoiceLevel( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, LevelMax = 0;
    Aig_ManForEachObj( p, pObj, i )
        Aig_ObjSetLevel( pObj, 0 );
    Aig_ManSetCioIds( p );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachCo( p, pObj, i )
    {
        Aig_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Aig_ObjLevel(pObj) )
            LevelMax = Aig_ObjLevel(pObj);
    }
    // account for dangling boxes
    Aig_ManForEachCi( p, pObj, i )
    {
        Aig_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Aig_ObjLevel(pObj) )
            LevelMax = Aig_ObjLevel(pObj);
    }
    Aig_ManCleanCioIds( p );
//    Aig_ManForEachNode( p, pObj, i )
//        assert( Aig_ObjLevel(pObj) > 0 );
    return LevelMax;
}